

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

bool __thiscall
Assimp::ColladaLoader::CanRead(ColladaLoader *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  ZipArchiveIOSystem *zip_archive_00;
  byte unaff_R15B;
  string extension;
  ZipArchiveIOSystem zip_archive;
  string local_90;
  undefined1 local_70 [40];
  string local_48;
  
  BaseImporter::GetExtension(&local_90,pFile);
  if (pIOHandler == (IOSystem *)0x0 || !checkSig) {
    iVar2 = std::__cxx11::string::compare((char *)&local_90);
    unaff_R15B = 1;
    if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)&local_90), iVar2 == 0))
    goto LAB_0040aa34;
  }
  else {
    ZipArchiveIOSystem::ZipArchiveIOSystem((ZipArchiveIOSystem *)local_70,pIOHandler,pFile,"r");
    bVar1 = ZipArchiveIOSystem::isOpen((ZipArchiveIOSystem *)local_70);
    if (bVar1) {
      ColladaParser::ReadZaeManifest_abi_cxx11_(&local_48,(ColladaParser *)local_70,zip_archive_00);
      unaff_R15B = local_48._M_string_length != 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    ZipArchiveIOSystem::~ZipArchiveIOSystem((ZipArchiveIOSystem *)local_70);
    if (bVar1) goto LAB_0040aa34;
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar2 == 0) {
    if (pIOHandler == (IOSystem *)0x0) {
      unaff_R15B = 1;
      goto LAB_0040aa34;
    }
  }
  else {
    unaff_R15B = local_90._M_string_length == 0 || checkSig;
    if (pIOHandler == (IOSystem *)0x0 || local_90._M_string_length != 0 && !checkSig)
    goto LAB_0040aa34;
  }
  unaff_R15B = BaseImporter::SearchFileHeaderForToken
                         (pIOHandler,pFile,CanRead::tokens,1,200,false,false);
LAB_0040aa34:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return (bool)(unaff_R15B & 1);
}

Assistant:

bool ColladaLoader::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const {
    // check file extension
    const std::string extension = GetExtension(pFile);

    bool readSig = checkSig && (pIOHandler != nullptr);

    if (!readSig) {
        if (extension == "dae" || extension == "zae") {
            return true;
        }
    }

    if (readSig) {
        // Look for a DAE file inside, but don't extract it
        ZipArchiveIOSystem zip_archive(pIOHandler, pFile);
        if (zip_archive.isOpen())
            return !ColladaParser::ReadZaeManifest(zip_archive).empty();
    }

    // XML - too generic, we need to open the file and search for typical keywords
    if (extension == "xml" || !extension.length() || checkSig) {
        /*  If CanRead() is called in order to check whether we
         *  support a specific file extension in general pIOHandler
         *  might be NULL and it's our duty to return true here.
         */
        if (!pIOHandler) {
            return true;
        }
        static const char* tokens[] = { "<collada" };
        return SearchFileHeaderForToken(pIOHandler, pFile, tokens, 1);
    }

    return false;
}